

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

uint compute_register_from_base(Function *fn,Pseudo *pseudo)

{
  uint uVar1;
  uint uVar2;
  Pseudo *pseudo_local;
  Function *fn_local;
  
  uVar1 = *(uint *)pseudo & 0xf;
  if (uVar1 == 0) {
    if (((pseudo->field_3).symbol)->symbol_type == SYM_LOCAL) {
      return *(uint *)pseudo >> 4 & 0xffff;
    }
  }
  else if ((uVar1 == 4) || (uVar1 == 0xb || uVar1 == 0xc)) {
    uVar1 = *(uint *)pseudo;
    uVar2 = num_locals(fn->proc);
    return (uVar1 >> 4 & 0xffff) + uVar2;
  }
  handle_error_bad_pseudo(fn,pseudo,"compute_register_from_base: Unexpected pseudo type");
  return 0xffffffff;
}

Assistant:

static unsigned compute_register_from_base(Function *fn, const Pseudo *pseudo)
{
	switch (pseudo->type) {
	case PSEUDO_TEMP_ANY:
	case PSEUDO_RANGE: // Compute starting register
	case PSEUDO_RANGE_SELECT:
		// we put all temps on Lua stack after the locals
		return pseudo->regnum + num_locals(fn->proc);
	case PSEUDO_SYMBOL:
		if (pseudo->symbol->symbol_type == SYM_LOCAL) {
			return pseudo->regnum;
		}
		// fallthrough
	default:
		handle_error_bad_pseudo(fn, pseudo, "compute_register_from_base: Unexpected pseudo type");
		return (unsigned)-1;
	}
}